

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Velocitizer.cpp
# Opt level: O1

void __thiscall OpenMD::Velocitizer::Velocitizer(Velocitizer *this,SimInfo *info)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  
  this->_vptr_Velocitizer = (_func_int **)&PTR__Velocitizer_002fcba0;
  this->info_ = info;
  (this->thermo_).info_ = info;
  peVar2 = (info->randNumGen_).
           super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this->globals_ = info->simParams_;
  (this->randNumGen_).super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = peVar2;
  p_Var1 = (info->randNumGen_).
           super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->randNumGen_).super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded != '\0') {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      return;
    }
    LOCK();
    p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    UNLOCK();
  }
  return;
}

Assistant:

Velocitizer::Velocitizer(SimInfo* info) :
      info_(info), thermo_(info), globals_(info->getSimParams()),
      randNumGen_(info->getRandomNumberGenerator()) {}